

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::CompareEdgeDirections(S2Point *a0,S2Point *a1,S2Point *b0,S2Point *b1)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  double *ap;
  double *ap_1;
  bool bVar6;
  undefined1 *puStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  undefined2 uStack_120;
  longdouble local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  Vector3_xf local_e8;
  Vector3_xf local_b8;
  Vector3_xf local_88;
  S2LogMessage local_50;
  S2LogMessage local_40;
  
  local_138._0_8_ = -a1->c_[0];
  local_138._10_6_ = (uint6)((ulong)a1->c_[1] >> 0x10) ^ 0x800000000000;
  local_138._8_2_ = SUB82(a1->c_[1],0);
  local_128 = (undefined1  [8])-a1->c_[2];
  if ((a0->c_[0] != (double)local_138._0_8_) || (NAN(a0->c_[0]) || NAN((double)local_138._0_8_))) {
    bVar6 = true;
  }
  else {
    lVar5 = 0;
    do {
      bVar6 = lVar5 == 0x10;
      if (bVar6) goto LAB_00218cb9;
      dVar2 = *(double *)((long)a0->c_ + lVar5 + 8);
      lVar3 = lVar5 + -8;
      lVar5 = lVar5 + 8;
    } while ((dVar2 == *(double *)(local_128 + lVar3)) &&
            (!NAN(dVar2) && !NAN(*(double *)(local_128 + lVar3))));
    bVar6 = false;
LAB_00218cb9:
    bVar6 = (bool)(bVar6 ^ 1);
  }
  if (bVar6) {
    local_138._0_8_ = -b1->c_[0];
    local_138._10_6_ = (uint6)((ulong)b1->c_[1] >> 0x10) ^ 0x800000000000;
    local_128 = (undefined1  [8])-b1->c_[2];
    local_138._8_2_ = SUB82(b1->c_[1],0);
    uStack_120 = 0;
    if ((b0->c_[0] != (double)local_138._0_8_) || (NAN(b0->c_[0]) || NAN((double)local_138._0_8_)))
    {
      bVar6 = true;
    }
    else {
      lVar5 = 0;
      do {
        bVar6 = lVar5 == 0x10;
        if (bVar6) goto LAB_00218d28;
        dVar2 = *(double *)((long)b0->c_ + lVar5 + 8);
        lVar3 = lVar5 + -8;
        lVar5 = lVar5 + 8;
      } while ((dVar2 == *(double *)(local_128 + lVar3)) &&
              (!NAN(dVar2) && !NAN(*(double *)(local_128 + lVar3))));
      bVar6 = false;
LAB_00218d28:
      bVar6 = (bool)(bVar6 ^ 1);
    }
    if (bVar6) {
      uStack_120 = 0;
      puStack_140 = (undefined1 *)0x218d4b;
      iVar4 = TriageCompareEdgeDirections<double>(a0,a1,b0,b1);
      if (iVar4 == 0) {
        local_f0 = a0->c_[0];
        local_f8 = a1->c_[0];
        if ((local_f0 == local_f8) && (!NAN(local_f0) && !NAN(local_f8))) {
          lVar5 = 0;
          do {
            if (lVar5 == 0x10) {
              return 0;
            }
            dVar2 = *(double *)((long)a0->c_ + lVar5 + 8);
            pdVar1 = (double *)((long)a1->c_ + lVar5 + 8);
            lVar5 = lVar5 + 8;
          } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
        }
        local_100 = b0->c_[0];
        local_108 = b1->c_[0];
        if ((local_100 == local_108) && (!NAN(local_100) && !NAN(local_108))) {
          lVar5 = 0;
          do {
            if (lVar5 == 0x10) {
              return 0;
            }
            dVar2 = *(double *)((long)b0->c_ + lVar5 + 8);
            pdVar1 = (double *)((long)b1->c_ + lVar5 + 8);
            lVar5 = lVar5 + 8;
          } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
        }
        _local_128 = (longdouble)a0->c_[1];
        local_118 = (longdouble)a0->c_[2];
        local_138._0_8_ = SUB108((longdouble)local_f0,0);
        local_138._8_2_ = (undefined2)((unkuint10)(longdouble)local_f0 >> 0x40);
        local_88.c_[0]._0_10_ = (BADTYPE)local_f8;
        local_88.c_[1]._0_10_ = (BADTYPE)a1->c_[1];
        local_88.c_[2]._0_10_ = (BADTYPE)a1->c_[2];
        local_b8.c_[0]._0_10_ = (BADTYPE)local_100;
        local_b8.c_[1]._0_10_ = (BADTYPE)b0->c_[1];
        local_b8.c_[2]._0_10_ = (BADTYPE)b0->c_[2];
        local_e8.c_[0]._0_10_ = (BADTYPE)local_108;
        local_e8.c_[1]._0_10_ = (BADTYPE)b1->c_[1];
        local_e8.c_[2]._0_10_ = (BADTYPE)b1->c_[2];
        puStack_140 = (undefined1 *)0x218e7a;
        iVar4 = TriageCompareEdgeDirections<long_double>
                          ((Vector3<long_double> *)local_138,(Vector3<long_double> *)&local_88,
                           (Vector3<long_double> *)&local_b8,(Vector3<long_double> *)&local_e8);
        if (iVar4 == 0) {
          puStack_140 = (undefined1 *)0x218e8d;
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (local_138,(BasicVector<Vector3,ExactFloat,3ul> *)a0);
          puStack_140 = (undefined1 *)0x218e9d;
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_88,(BasicVector<Vector3,ExactFloat,3ul> *)a1);
          puStack_140 = (undefined1 *)0x218ead;
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_b8,(BasicVector<Vector3,ExactFloat,3ul> *)b0);
          puStack_140 = (undefined1 *)0x218eba;
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_e8,(BasicVector<Vector3,ExactFloat,3ul> *)b1);
          puStack_140 = (undefined1 *)0x218ed7;
          iVar4 = ExactCompareEdgeDirections((Vector3_xf *)local_138,&local_88,&local_b8,&local_e8);
          lVar5 = 0x30;
          do {
            puStack_140 = (undefined1 *)0x218ee9;
            BN_free(*(BIGNUM **)((long)local_e8.c_ + lVar5 + -8));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
          lVar5 = 0x30;
          do {
            puStack_140 = (undefined1 *)0x218efe;
            BN_free(*(BIGNUM **)((long)&local_e8.c_[2].bn_.bn_ + lVar5));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
          lVar5 = 0x30;
          do {
            puStack_140 = (undefined1 *)0x218f16;
            BN_free(*(BIGNUM **)((long)&local_b8.c_[2].bn_.bn_ + lVar5));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
          lVar5 = 0x30;
          do {
            puStack_140 = (undefined1 *)0x218f2b;
            BN_free(*(BIGNUM **)((long)&puStack_140 + lVar5));
            lVar5 = lVar5 + -0x10;
          } while (lVar5 != 0);
        }
      }
      return iVar4;
    }
    puStack_140 = (undefined1 *)0x218fae;
    S2LogMessage::S2LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,800,kFatal,(ostream *)&std::cerr);
    puStack_140 = (undefined1 *)0x218fc3;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_50.stream_,"Check failed: (b0) != (-b1) ",0x1c);
  }
  else {
    puStack_140 = (undefined1 *)0x218f5e;
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,799,kFatal,(ostream *)&std::cerr);
    puStack_140 = (undefined1 *)0x218f73;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: (a0) != (-a1) ",0x1c);
  }
  puStack_140 = &LAB_00218fd1;
  abort();
}

Assistant:

int CompareEdgeDirections(const S2Point& a0, const S2Point& a1,
                          const S2Point& b0, const S2Point& b1) {
  // Check that no edge consists of antipodal points.  (This catches the most
  // common case -- the full test is in ExactCompareEdgeDirections.)
  S2_DCHECK_NE(a0, -a1);
  S2_DCHECK_NE(b0, -b1);

  int sign = TriageCompareEdgeDirections(a0, a1, b0, b1);
  if (sign != 0) return sign;

  // Optimization for the case where either edge is degenerate.
  if (a0 == a1 || b0 == b1) return 0;

  sign = TriageCompareEdgeDirections(ToLD(a0), ToLD(a1), ToLD(b0), ToLD(b1));
  if (sign != 0) return sign;
  return ExactCompareEdgeDirections(ToExact(a0), ToExact(a1),
                                    ToExact(b0), ToExact(b1));
}